

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

bool __thiscall
Reducer::tryToEmptyFunctions(Reducer *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *names)

{
  pointer pNVar1;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  undefined4 *puVar5;
  ostream *poVar6;
  pointer pNVar7;
  long lVar8;
  long extraout_RDX;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range1;
  MixedArena *this_00;
  ulong uVar9;
  Name NVar10;
  Name NVar11;
  Expression *local_58;
  Expression *oldBody;
  void *pvStack_48;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> oldBodies;
  
  pvStack_48 = (void *)0x0;
  oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar7 = (names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1 = (names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar7 != pNVar1) {
    oldBody = (Expression *)0x0;
    do {
      NVar10.super_IString.str._M_str = (char *)(pNVar7->super_IString).str._M_len;
      NVar10.super_IString.str._M_len =
           (size_t)(this->module)._M_t.
                   super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                   super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
      lVar4 = wasm::Module::getFunction(NVar10);
      local_58 = *(Expression **)(lVar4 + 0x60);
      if (oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pvStack_48,
                   (iterator)
                   oldBodies.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,&local_58);
      }
      else {
        *oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_start = local_58;
        oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      if ((*(long *)(lVar4 + 0x20) == 0) && ((local_58->_id & ~BlockId) != NopId)) {
        wasm::HeapType::getSignature();
        this_00 = &((this->builder)._M_t.
                    super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                    super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->allocator;
        if (extraout_RDX == 0) {
          puVar5 = (undefined4 *)MixedArena::allocSpace(this_00,0x10,8);
          *puVar5 = 0x16;
        }
        else {
          puVar5 = (undefined4 *)MixedArena::allocSpace(this_00,0x10,8);
          *puVar5 = 0x17;
        }
        oldBody = (Expression *)((long)&oldBody->_id + 1);
        *(ulong *)(puVar5 + 2) = (ulong)(extraout_RDX != 0);
        *(undefined4 **)(lVar4 + 0x60) = puVar5;
      }
      pNVar7 = pNVar7 + 1;
    } while (pNVar7 != pNVar1);
    if (oldBody != (Expression *)0x0) {
      bVar3 = writeAndTestReduction(this);
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"|        emptied ",0x11);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        bVar3 = true;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," functions\n",0xb);
        goto LAB_001270fd;
      }
    }
  }
  pNVar7 = (names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
      super__Vector_impl_data._M_finish != pNVar7) {
    lVar4 = 8;
    uVar9 = 0;
    do {
      uVar2 = *(undefined8 *)((long)pvStack_48 + uVar9 * 8);
      NVar11.super_IString.str._M_str = *(char **)((long)pNVar7 + lVar4 + -8);
      NVar11.super_IString.str._M_len =
           (size_t)(this->module)._M_t.
                   super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                   super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
      lVar8 = wasm::Module::getFunction(NVar11);
      *(undefined8 *)(lVar8 + 0x60) = uVar2;
      uVar9 = uVar9 + 1;
      pNVar7 = (names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar9 < (ulong)((long)(names->
                                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 4));
  }
  bVar3 = false;
LAB_001270fd:
  if (pvStack_48 != (void *)0x0) {
    operator_delete(pvStack_48,
                    (long)oldBodies.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvStack_48);
  }
  return bVar3;
}

Assistant:

bool tryToEmptyFunctions(std::vector<Name> names) {
    std::vector<Expression*> oldBodies;
    size_t actuallyEmptied = 0;
    for (auto name : names) {
      auto* func = module->getFunction(name);
      auto* oldBody = func->body;
      oldBodies.push_back(oldBody);
      // Nothing to do for imported functions (body is nullptr) or for bodies
      // that have already been as reduced as we can make them.
      if (func->imported() || oldBody->is<Unreachable>() ||
          oldBody->is<Nop>()) {
        continue;
      }
      actuallyEmptied++;
      bool useUnreachable = func->getResults() != Type::none;
      if (useUnreachable) {
        func->body = builder->makeUnreachable();
      } else {
        func->body = builder->makeNop();
      }
    }
    if (actuallyEmptied > 0 && writeAndTestReduction()) {
      std::cerr << "|        emptied " << actuallyEmptied << " / "
                << names.size() << " functions\n";
      return true;
    } else {
      // Restore the bodies.
      for (size_t i = 0; i < names.size(); i++) {
        module->getFunction(names[i])->body = oldBodies[i];
      }
      return false;
    }
  }